

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O1

void duckdb::LeastFun::GetFunctions(void)

{
  ScalarFunctionSet *in_RDI;
  ScalarFunction local_138;
  
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  GetLeastGreatestFunction<duckdb::LeastOp>();
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_138);
  local_138._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_138.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_138.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_138.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_138 + 0xb0U),(_Any_data *)((long)&local_138 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_138.super_BaseScalarFunction);
  return;
}

Assistant:

ScalarFunctionSet LeastFun::GetFunctions() {
	return GetLeastGreatestFunctions<LeastOp>();
}